

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate.cpp
# Opt level: O1

Aggregate * __thiscall hta::Aggregate::operator+=(Aggregate *this,Aggregate other)

{
  double dVar1;
  
  dVar1 = this->minimum;
  if (other.minimum <= this->minimum) {
    dVar1 = other.minimum;
  }
  this->minimum = dVar1;
  dVar1 = this->maximum;
  if (this->maximum <= other.maximum) {
    dVar1 = other.maximum;
  }
  this->maximum = dVar1;
  this->sum = other.sum + this->sum;
  this->count = this->count + other.count;
  this->integral = other.integral + this->integral;
  (this->active_time).__r = (this->active_time).__r + other.active_time.__r;
  return this;
}

Assistant:

Aggregate& Aggregate::operator+=(Aggregate other)
{
    minimum = std::min(other.minimum, minimum);
    maximum = std::max(other.maximum, maximum);
    sum += other.sum;
    count += other.count;
    integral += other.integral;
    active_time += other.active_time;
    return *this;
}